

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_types.h
# Opt level: O0

uint glsl_base_type_bit_size(glsl_base_type type)

{
  uint local_c;
  glsl_base_type type_local;
  
  switch(type) {
  case GLSL_TYPE_UINT:
  case GLSL_TYPE_INT:
  case GLSL_TYPE_FLOAT:
  case GLSL_TYPE_BOOL:
  case GLSL_TYPE_SUBROUTINE:
    local_c = 0x20;
    break;
  case GLSL_TYPE_FLOAT16:
  case GLSL_TYPE_UINT16:
  case GLSL_TYPE_INT16:
    local_c = 0x10;
    break;
  case GLSL_TYPE_DOUBLE:
  case GLSL_TYPE_UINT64:
  case GLSL_TYPE_INT64:
  case GLSL_TYPE_SAMPLER:
  case GLSL_TYPE_IMAGE:
    local_c = 0x40;
    break;
  case GLSL_TYPE_UINT8:
  case GLSL_TYPE_INT8:
    local_c = 8;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

static unsigned glsl_base_type_bit_size(enum glsl_base_type type)
{
   switch (type) {
   case GLSL_TYPE_BOOL:
   case GLSL_TYPE_INT:
   case GLSL_TYPE_UINT:
   case GLSL_TYPE_FLOAT: /* TODO handle mediump */
   case GLSL_TYPE_SUBROUTINE:
      return 32;

   case GLSL_TYPE_FLOAT16:
   case GLSL_TYPE_UINT16:
   case GLSL_TYPE_INT16:
      return 16;

   case GLSL_TYPE_UINT8:
   case GLSL_TYPE_INT8:
      return 8;

   case GLSL_TYPE_DOUBLE:
   case GLSL_TYPE_INT64:
   case GLSL_TYPE_UINT64:
   case GLSL_TYPE_IMAGE:
   case GLSL_TYPE_SAMPLER:
      return 64;

   default:
      /* For GLSL_TYPE_STRUCT etc, it should be ok to return 0. This usually
       * happens when calling this method through is_64bit and is_16bit
       * methods
       */
      return 0;
   }

   return 0;
}